

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O0

size_t embree::SceneGraph::sizeOfType(Tag ty)

{
  runtime_error *this;
  undefined4 in_EDI;
  size_t local_8;
  
  switch(in_EDI) {
  case 0:
    local_8 = 1;
    break;
  case 1:
    local_8 = 1;
    break;
  case 2:
    local_8 = 2;
    break;
  case 3:
    local_8 = 2;
    break;
  case 4:
    local_8 = 4;
    break;
  case 5:
    local_8 = 4;
    break;
  case 6:
    local_8 = 4;
    break;
  case 7:
    local_8 = 8;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"invalid type");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_8;
}

Assistant:

size_t sizeOfType(Type::Tag ty) 
    {
      switch (ty) {
      case Type::PTY_CHAR : return 1;
      case Type::PTY_UCHAR : return 1;
      case Type::PTY_SHORT : return 2;
      case Type::PTY_USHORT : return 2;
      case Type::PTY_INT : return 4;
      case Type::PTY_UINT : return 4;
      case Type::PTY_FLOAT : return 4;
      case Type::PTY_DOUBLE : return 8;
      default : throw std::runtime_error("invalid type");
      }
    }